

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_3>_>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
::Tuple4(Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_3>_>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
         *this,ExprP<tcu::Vector<float,_3>_> *e0,ExprP<float> *e1,
        ExprP<vkt::shaderexecutor::Void> *e2,ExprP<vkt::shaderexecutor::Void> *e3)

{
  ExprP<vkt::shaderexecutor::Void> *e3_local;
  ExprP<vkt::shaderexecutor::Void> *e2_local;
  ExprP<float> *e1_local;
  ExprP<tcu::Vector<float,_3>_> *e0_local;
  Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_3>_>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
  *this_local;
  
  ExprP<tcu::Vector<float,_3>_>::ExprP(&this->a,e0);
  ExprP<float>::ExprP(&this->b,e1);
  ExprP<vkt::shaderexecutor::Void>::ExprP(&this->c,e2);
  ExprP<vkt::shaderexecutor::Void>::ExprP(&this->d,e3);
  return;
}

Assistant:

explicit Tuple4 (const T0& e0 = T0(),
					 const T1& e1 = T1(),
					 const T2& e2 = T2(),
					 const T3& e3 = T3())
		: a	(e0)
		, b	(e1)
		, c	(e2)
		, d	(e3)
	{
	}